

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int libssh2_channel_eof(LIBSSH2_CHANNEL *channel)

{
  uint32_t uVar1;
  list_node *node;
  uint32_t uVar2;
  list_node *plVar3;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  plVar3 = (list_node *)_libssh2_list_first(&channel->session->packets);
  do {
    node = plVar3;
    if (node == (list_node *)0x0) {
      return (int)(channel->remote).eof;
    }
    plVar3 = (list_node *)_libssh2_list_next(node);
  } while ((((node[1].prev == (list_node *)0x0) || (node[1].prev < (list_node *)0x5)) ||
           (((ulong)(node[1].next)->next & 0xfe) != 0x5e)) ||
          (uVar1 = (channel->local).id,
          uVar2 = _libssh2_ntohu32((uchar *)((long)&(node[1].next)->next + 1)), uVar1 != uVar2));
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_channel_eof(LIBSSH2_CHANNEL * channel)
{
    LIBSSH2_SESSION *session;
    LIBSSH2_PACKET *packet;
    LIBSSH2_PACKET *next_packet;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    session = channel->session;
    packet = _libssh2_list_first(&session->packets);

    while(packet) {

        next_packet = _libssh2_list_next(&packet->node);

        if(packet->data_len < 1) {
            packet = next_packet;
            _libssh2_debug((channel->session, LIBSSH2_TRACE_ERROR,
                           "Unexpected packet length"));
            continue;
        }

        if(((packet->data[0] == SSH_MSG_CHANNEL_DATA)
            || (packet->data[0] == SSH_MSG_CHANNEL_EXTENDED_DATA))
            && ((packet->data_len >= 5)
            && (channel->local.id == _libssh2_ntohu32(packet->data + 1)))) {
            /* There's data waiting to be read yet, mask the EOF status */
            return 0;
        }
        packet = next_packet;
    }

    return channel->remote.eof;
}